

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_posix::time_put_posix<char>::do_put
          (time_put_posix<char> *this,iter_type out,ios_base *param_2,char param_3,tm *tm,
          char format,char modifier)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  streambuf_type *psVar4;
  undefined7 in_register_00000081;
  ulong uVar5;
  bool bVar6;
  iter_type iVar7;
  char_type fmt [4];
  ftime_traits<char> local_44;
  char local_43;
  char local_42;
  undefined1 local_41;
  string local_40;
  
  psVar4 = out._M_sbuf;
  uVar3 = out._8_4_;
  bVar6 = modifier == '\0';
  if (bVar6) {
    modifier = format;
  }
  local_44 = (ftime_traits<char>)0x25;
  local_42 = '\0';
  if (!bVar6) {
    local_42 = format;
  }
  local_41 = 0;
  local_43 = modifier;
  ftime_traits<char>::ftime_abi_cxx11_
            (&local_40,&local_44,(char *)tm,
             (tm *)*(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(locale_t)CONCAT71(in_register_00000081,param_3));
  if (local_40._M_string_length != 0) {
    uVar2 = 0;
    uVar5 = 1;
    do {
      if ((uVar3 & 1) == 0) {
        if (*(char **)(psVar4 + 0x28) < *(char **)(psVar4 + 0x30)) {
          **(char **)(psVar4 + 0x28) = local_40._M_dataplus._M_p[uVar2];
          *(long *)(psVar4 + 0x28) = *(long *)(psVar4 + 0x28) + 1;
        }
        else {
          iVar1 = (**(code **)(*(long *)psVar4 + 0x68))(psVar4,local_40._M_dataplus._M_p[uVar2]);
          uVar3 = uVar3 & 0xff;
          if (iVar1 == -1) {
            uVar3 = 1;
          }
        }
      }
      bVar6 = uVar5 < local_40._M_string_length;
      uVar2 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar7._8_4_ = uVar3;
  iVar7._M_sbuf = psVar4;
  iVar7._12_4_ = 0;
  return iVar7;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType /*fill*/,std::tm const *tm,char format,char modifier) const
    {
        char_type fmt[4] = { '%' , modifier != 0 ? modifier : format , modifier == 0 ? '\0' : format };
        string_type res = ftime_traits<char_type>::ftime(fmt,tm,*lc_);
        for(unsigned i=0;i<res.size();i++)
            *out++ = res[i];
        return out;
    }